

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON_writer.hh
# Opt level: O3

Writer * __thiscall JSON::Writer::writeNext(Writer *this)

{
  long lVar1;
  char *pcVar2;
  ulong uVar3;
  
  uVar3 = this->indent;
  if (this->first == true) {
    this->first = false;
    pcVar2 = "\n                                                  ";
    lVar1 = 1;
  }
  else {
    pcVar2 = ",\n                                                  ";
    lVar1 = 2;
  }
  (*this->p->_vptr_Pipeline[2])(this->p,pcVar2,uVar3 % 0x32 + lVar1);
  for (; 0x31 < uVar3; uVar3 = uVar3 - 0x32) {
    (*this->p->_vptr_Pipeline[2])(this->p,"                                                  ",0x32)
    ;
  }
  return this;
}

Assistant:

Writer&
    writeNext()
    {
        auto n = indent;
        if (first) {
            first = false;
            write(&spaces[1], n % n_spaces + 1);
        } else {
            write(&spaces[0], n % n_spaces + 2);
        }
        while (n >= n_spaces) {
            write(&spaces[2], n_spaces);
            n -= n_spaces;
        }
        return *this;
    }